

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

nghttp2_outbound_item * session_sched_get_next_outbound_item(nghttp2_session *session)

{
  nghttp2_pq_entry *pnVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 + 0x28 == 0x168) {
      return (nghttp2_outbound_item *)0x0;
    }
    pnVar1 = nghttp2_pq_top((nghttp2_pq *)((long)&session->sched[0].ob_data.q + lVar2));
    lVar2 = lVar2 + 0x28;
  } while (pnVar1 == (nghttp2_pq_entry *)0x0);
  return (nghttp2_outbound_item *)pnVar1[0x13].index;
}

Assistant:

static nghttp2_outbound_item *
session_sched_get_next_outbound_item(nghttp2_session *session) {
  size_t i;
  nghttp2_pq_entry *ent;
  nghttp2_stream *stream;

  for (i = 0; i < NGHTTP2_EXTPRI_URGENCY_LEVELS; ++i) {
    ent = nghttp2_pq_top(&session->sched[i].ob_data);
    if (!ent) {
      continue;
    }

    stream = nghttp2_struct_of(ent, nghttp2_stream, pq_entry);
    return stream->item;
  }

  return NULL;
}